

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool __thiscall
Lodtalk::MethodCompiler::generateOptimizedMessage
          (MethodCompiler *this,MessageSendNode *node,CompilerOptimizedSelector optimizedSelector)

{
  bool negated;
  int iVar1;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__x;
  Node *receiver;
  Node *stopNode;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  Node *receiver_00;
  bool bVar3;
  uint *node_00;
  MethodCompiler *this_00;
  Node *in_R8;
  Node *in_R9;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> arguments;
  _Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> local_38;
  
  __x = AST::MessageSendNode::getArguments(node);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector
            ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)&local_38,__x);
  receiver = AST::MessageSendNode::getReceiver(node);
  if (0xe < (uint)optimizedSelector) {
switchD_00144c78_caseD_a:
    fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
            "bool Lodtalk::MethodCompiler::generateOptimizedMessage(MessageSendNode *, CompilerOptimizedSelector)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
            ,0x52c);
    abort();
  }
  aVar2.pointer = (uint8_t *)&TrueObject;
  negated = false;
  node_00 = &switchD_00144c78::switchdataD_00159d9c;
  stopNode = (Node *)((long)&switchD_00144c78::switchdataD_00159d9c +
                     (long)(int)(&switchD_00144c78::switchdataD_00159d9c)[(uint)optimizedSelector]);
  switch(optimizedSelector) {
  case IfTrue:
    goto switchD_00144c78_caseD_0;
  case IfFalse:
    aVar2.pointer = (uint8_t *)&FalseObject;
    goto LAB_00144d1d;
  case IfTrueIfFalse:
    goto switchD_00144c78_caseD_2;
  case IfFalseIfTrue:
    aVar2.pointer = (uint8_t *)&FalseObject;
    goto LAB_00144d64;
  case IfNil:
    aVar2.pointer = (uint8_t *)&NilObject;
LAB_00144d1d:
    negated = false;
    goto switchD_00144c78_caseD_0;
  case IfNotNil:
    negated = true;
    aVar2.pointer = (uint8_t *)&NilObject;
switchD_00144c78_caseD_0:
    bVar3 = true;
    generateIf(this,node,(Oop)aVar2,receiver,*local_38._M_impl.super__Vector_impl_data._M_start,
               negated);
    goto LAB_00144d86;
  case IfNilIfNotNil:
    aVar2.pointer = (uint8_t *)&NilObject;
LAB_00144d64:
    negated = false;
    goto switchD_00144c78_caseD_2;
  case IfNotNilIfNil:
    negated = true;
    aVar2.pointer = (uint8_t *)&NilObject;
switchD_00144c78_caseD_2:
    bVar3 = true;
    generateIfElse(this,(MessageSendNode *)&switchD_00144c78::switchdataD_00159d9c,(Oop)aVar2,
                   receiver,*local_38._M_impl.super__Vector_impl_data._M_start,
                   local_38._M_impl.super__Vector_impl_data._M_start[1],negated);
    goto LAB_00144d86;
  case WhileTrue:
switchD_00144c78_caseD_8:
    iVar1 = (*receiver->_vptr_Node[5])(receiver);
    if ((char)iVar1 != '\0') {
      aVar2.pointer = (uint8_t *)&TrueObject;
LAB_00144cfa:
      bVar3 = true;
      generateWhile(this,(MessageSendNode *)node_00,(Oop)aVar2,receiver,
                    *local_38._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00144d86;
    }
    break;
  case WhileFalse:
    iVar1 = (*receiver->_vptr_Node[5])(receiver);
    if ((char)iVar1 != '\0') {
      aVar2.pointer = (uint8_t *)&FalseObject;
      goto LAB_00144cfa;
    }
    break;
  default:
    goto switchD_00144c78_caseD_a;
  case ToByDo:
    this_00 = (MethodCompiler *)local_38._M_impl.super__Vector_impl_data._M_start[2];
    iVar1 = (*(this_00->super_AbstractASTVisitor).super_ASTVisitor._vptr_ASTVisitor[5])();
    if ((char)iVar1 != '\0') {
      generateToByDo(this_00,(MessageSendNode *)node_00,receiver_00,stopNode,in_R8,in_R9);
      goto switchD_00144c78_caseD_8;
    }
    break;
  case ToDo:
    iVar1 = (*local_38._M_impl.super__Vector_impl_data._M_start[1]->_vptr_Node[5])();
    if ((char)iVar1 != '\0') {
      bVar3 = true;
      generateToDo(this,(MessageSendNode *)node_00,receiver,
                   *local_38._M_impl.super__Vector_impl_data._M_start,
                   local_38._M_impl.super__Vector_impl_data._M_start[1]);
      goto LAB_00144d86;
    }
  }
  bVar3 = false;
LAB_00144d86:
  std::_Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~_Vector_base
            (&local_38);
  return bVar3;
}

Assistant:

bool MethodCompiler::generateOptimizedMessage(MessageSendNode *node, CompilerOptimizedSelector optimizedSelector)
{
    auto arguments = node->getArguments();
    auto receiver = node->getReceiver();

    switch(optimizedSelector)
    {
    case CompilerOptimizedSelector::IfTrue:
        generateIf(node, trueOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfFalse:
        generateIf(node, falseOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfNil:
        generateIf(node, nilOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfNotNil:
        generateIf(node, nilOop(), receiver, arguments[0], true);
        break;
    case CompilerOptimizedSelector::IfTrueIfFalse:
        generateIfElse(node, trueOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfFalseIfTrue:
        generateIfElse(node, falseOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfNilIfNotNil:
        generateIfElse(node, nilOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfNotNilIfNil:
        generateIfElse(node, nilOop(), receiver, arguments[0], arguments[1], true);
        break;
    case CompilerOptimizedSelector::WhileTrue:
        if(!receiver->isBlockExpression())
            return false;
        generateWhile(node, trueOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::WhileFalse:
        if(!receiver->isBlockExpression())
            return false;
        generateWhile(node, falseOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::ToDo:
        if(!arguments[1]->isBlockExpression())
            return false;
        generateToDo(node, receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::ToByDo:
        if(!arguments[2]->isBlockExpression())
            return false;
        generateToByDo(node, receiver, arguments[0], arguments[1], arguments[2]);
        break;
    default:
        LODTALK_UNIMPLEMENTED();
    }

    return true;
}